

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkDupDfsNoBarBufs(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  char *__s;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *pVVar5;
  Abc_Ntk_t *pAVar6;
  size_t sVar7;
  char *__dest;
  long lVar8;
  long lVar9;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  else {
    if (pNtk->ntkType != ABC_NTK_LOGIC) {
      __assert_fail("Abc_NtkIsLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x213,"Abc_Ntk_t *Abc_NtkDupDfsNoBarBufs(Abc_Ntk_t *)");
    }
    if (pNtk->nBarBufs2 < 1) {
      __assert_fail("pNtk->nBarBufs2 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                    ,0x214,"Abc_Ntk_t *Abc_NtkDupDfsNoBarBufs(Abc_Ntk_t *)");
    }
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,pNtk->ntkFunc);
    pVVar5 = Abc_NtkDfs2(pNtk);
    if (0 < pVVar5->nSize) {
      lVar8 = 0;
      do {
        pAVar1 = (Abc_Obj_t *)pVVar5->pArray[lVar8];
        if ((((pAVar1->pNtk->ntkFunc == ABC_FUNC_MAP) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 7)
             ) && ((pAVar1->vFanins).nSize == 1)) && ((pAVar1->field_5).pData == (void *)0x0)) {
          pAVar1->field_6 =
               *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)
                ((long)pAVar1->pNtk->vObjs->pArray[*(pAVar1->vFanins).pArray] + 0x40);
        }
        else {
          Abc_NtkDupObj(pNtkNew,pAVar1,0);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar5->nSize);
    }
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (void **)0x0;
    }
    if (pVVar5 != (Vec_Ptr_t *)0x0) {
      free(pVVar5);
    }
    pVVar5 = pNtk->vObjs;
    if (0 < pVVar5->nSize) {
      lVar8 = 0;
      do {
        plVar2 = (long *)pVVar5->pArray[lVar8];
        if (((((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xe) != 8)) &&
             ((uVar3 = *(uint *)((long)plVar2 + 0x14) & 0xf, uVar3 != 5 && (uVar3 != 10)))) &&
            (((uVar3 != 7 || (*(int *)(*plVar2 + 4) != 4)) ||
             ((*(int *)((long)plVar2 + 0x1c) != 1 || (plVar2[7] != 0)))))) &&
           (0 < *(int *)((long)plVar2 + 0x1c))) {
          lVar9 = 0;
          do {
            if (((Abc_Obj_t *)plVar2[8] != (Abc_Obj_t *)0x0) &&
               (pAVar1 = *(Abc_Obj_t **)
                          (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                    (long)*(int *)(plVar2[4] + lVar9 * 4) * 8) + 0x40),
               pAVar1 != (Abc_Obj_t *)0x0)) {
              Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],pAVar1);
            }
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)((long)plVar2 + 0x1c));
        }
        lVar8 = lVar8 + 1;
        pVVar5 = pNtk->vObjs;
      } while (lVar8 < pVVar5->nSize);
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar6 = Abc_NtkDup(pNtk->pExdc);
      pNtkNew->pExdc = pAVar6;
    }
    if ((Abc_Ntk_t *)pNtk->pExcare != (Abc_Ntk_t *)0x0) {
      pAVar6 = Abc_NtkDup((Abc_Ntk_t *)pNtk->pExcare);
      pNtkNew->pExcare = pAVar6;
    }
    if (pNtk->pManTime != (Abc_ManTime_t *)0x0) {
      Abc_NtkTimeInitialize(pNtkNew,pNtk);
    }
    if (pNtk->vPhases != (Vec_Int_t *)0x0) {
      Abc_NtkTransferPhases(pNtkNew,pNtk);
    }
    __s = pNtk->pWLoadUsed;
    if (__s != (char *)0x0) {
      sVar7 = strlen(__s);
      __dest = (char *)malloc(sVar7 + 1);
      strcpy(__dest,__s);
      pNtkNew->pWLoadUsed = __dest;
    }
    iVar4 = Abc_NtkCheck(pNtkNew);
    if (iVar4 == 0) {
      fwrite("Abc_NtkDup(): Network check has failed.\n",0x28,1,_stdout);
    }
    pNtk->pCopy = pNtkNew;
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkDupDfsNoBarBufs( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    if ( pNtk == NULL )
        return NULL;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtk->nBarBufs2 > 0 );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, pNtk->ntkType, pNtk->ntkFunc );
    // copy the internal nodes
    vNodes = Abc_NtkDfs2( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        if ( Abc_ObjIsBarBuf(pObj) )
            pObj->pCopy = Abc_ObjFanin0(pObj)->pCopy;
        else
            Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Vec_PtrFree( vNodes );
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) && !Abc_ObjIsBarBuf(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                if ( pObj->pCopy && pFanin->pCopy )
                    Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    if ( pNtk->pExcare )
        pNtkNew->pExcare = Abc_NtkDup( (Abc_Ntk_t *)pNtk->pExcare );
    // duplicate timing manager
    if ( pNtk->pManTime )
        Abc_NtkTimeInitialize( pNtkNew, pNtk );
    if ( pNtk->vPhases )
        Abc_NtkTransferPhases( pNtkNew, pNtk );
    if ( pNtk->pWLoadUsed )
        pNtkNew->pWLoadUsed = Abc_UtilStrsav( pNtk->pWLoadUsed );
    // check correctness
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    pNtk->pCopy = pNtkNew;
    return pNtkNew;
}